

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmimage.cpp
# Opt level: O0

char * __thiscall CVmImageFileExt_blk::suballoc(CVmImageFileExt_blk *this,size_t siz)

{
  char *ret;
  size_t siz_local;
  CVmImageFileExt_blk *this_local;
  char *local_8;
  
  if (this->rem_ < siz) {
    local_8 = (char *)0x0;
  }
  else {
    local_8 = this->free_ptr_;
    this->free_ptr_ = this->free_ptr_ + siz;
    this->rem_ = this->rem_ - siz;
  }
  return local_8;
}

Assistant:

char *CVmImageFileExt_blk::suballoc(size_t siz)
{
    char *ret;
    
    /* if we don't have enough memory available, fail the request */
    if (rem_ < siz)
        return 0;

    /* our return value will be the current free pointer */
    ret = free_ptr_;

    /* move the free pointer past the allocated block */
    free_ptr_ += siz;

    /* deduct the amount we just allocated from the space available */
    rem_ -= siz;

    /* return the memory */
    return ret;
}